

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

int __thiscall notch::core::Net::init(Net *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  pointer psVar2;
  function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
  *in_RDX;
  ulong uVar3;
  long lVar4;
  _Any_data local_50;
  code *local_40;
  
  psVar2 = (this->layers).
           super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->layers).
      super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      plVar1 = *(long **)((long)&(psVar2->
                                 super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar4);
      std::
      function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
      ::function((function<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
                  *)&local_50,in_RDX);
      (**(code **)(*plVar1 + 0x18))(plVar1,ctx,&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      uVar3 = uVar3 + 1;
      psVar2 = (this->layers).
               super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < (ulong)((long)(this->layers).
                                   super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4));
  }
  return (int)psVar2;
}

Assistant:

virtual void
    init(std::unique_ptr<RNG> &rng, WeightInit init = Init::normalXavier) {
        for (size_t i = 0u; i < layers.size(); ++i) {
            layers[i]->init(rng, init);
        }
    }